

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::session_impl::add_ses_extension
          (session_impl *this,shared_ptr<libtorrent::plugin> *ext)

{
  _Atomic_word *p_Var1;
  element_type *peVar2;
  uint uVar3;
  int iVar4;
  session_handle h;
  undefined8 local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  shared_ptr<libtorrent::plugin> local_40;
  undefined8 local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  uVar3 = (*((ext->super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_plugin[2])();
  ::std::
  vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  ::push_back((this->m_ses_extensions)._M_elems,ext);
  if ((uVar3 & 2) != 0) {
    ::std::
    vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
    ::push_back((this->m_ses_extensions)._M_elems + 1,ext);
  }
  if ((uVar3 & 4) != 0) {
    ::std::
    vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
    ::push_back((this->m_ses_extensions)._M_elems + 2,ext);
  }
  if ((uVar3 & 8) != 0) {
    ::std::
    vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
    ::push_back((this->m_ses_extensions)._M_elems + 3,ext);
  }
  if ((uVar3 & 0x20) != 0) {
    ::std::
    vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
    ::push_back((this->m_ses_extensions)._M_elems + 4,ext);
  }
  if ((uVar3 & 0x10) != 0) {
    local_40.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (ext->super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_40.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (ext->super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
    ;
    if (local_40.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_40.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_40.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_40.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_40.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    alert_manager::add_extension(&this->m_alerts,&local_40);
    if (local_40.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  ::std::__shared_ptr<libtorrent::aux::session_impl,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::aux::session_impl,void>
            ((__shared_ptr<libtorrent::aux::session_impl,(__gnu_cxx::_Lock_policy)2> *)&local_30,
             (__weak_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<libtorrent::aux::session_impl>);
  if (local_28 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_50 = local_30;
    local_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_28->_M_weak_count = local_28->_M_weak_count + 1;
      UNLOCK();
      local_50 = local_30;
      local_48 = local_28;
      if (local_28 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_002bca72;
    }
    else {
      local_28->_M_weak_count = local_28->_M_weak_count + 1;
    }
    local_50 = local_30;
    local_48 = local_28;
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
LAB_002bca72:
  peVar2 = (ext->super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar2->_vptr_plugin[4])(peVar2,&local_50);
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &local_48->_M_weak_count;
      iVar4 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = local_48->_M_weak_count;
      local_48->_M_weak_count = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (*local_48->_vptr__Sp_counted_base[3])();
    }
  }
  return;
}

Assistant:

void session_impl::add_ses_extension(std::shared_ptr<plugin> ext)
	{
		// this is called during startup of the session, from the thread creating
		// it, not its own thread
//		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT_VAL(ext, ext);

		feature_flags_t const features = ext->implemented_features();

		m_ses_extensions[plugins_all_idx].push_back(ext);

		if (features & plugin::optimistic_unchoke_feature)
			m_ses_extensions[plugins_optimistic_unchoke_idx].push_back(ext);
		if (features & plugin::tick_feature)
			m_ses_extensions[plugins_tick_idx].push_back(ext);
		if (features & plugin::dht_request_feature)
			m_ses_extensions[plugins_dht_request_idx].push_back(ext);
		if (features & plugin::unknown_torrent_feature)
			m_ses_extensions[plugins_unknown_torrent_idx].push_back(ext);
		if (features & plugin::alert_feature)
			m_alerts.add_extension(ext);
		session_handle h(shared_from_this());
		ext->added(h);
	}